

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O3

int __thiscall
helics::zeromq::ZmqCommsSS::processIncomingMessage
          (ZmqCommsSS *this,message_t *msg,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *connection_info)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *data;
  size_t size;
  ostream *poVar4;
  string *address;
  ConnectionStatus status;
  string_view message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sdata;
  ActionMessage M;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  undefined1 local_f8 [128];
  size_t local_78;
  byte *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  lVar2 = zmq_msg_size(msg);
  if (lVar2 == 5) {
    lVar2 = zmq_msg_data(msg);
    lVar3 = zmq_msg_size(msg);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,lVar2,lVar3 + lVar2);
    iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                    "close");
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if (iVar1 == 0) {
      return -1;
    }
  }
  data = (void *)zmq_msg_data(msg);
  size = zmq_msg_size(msg);
  ActionMessage::ActionMessage((ActionMessage *)local_f8,data,size);
  if (0xf69b4 < (int)local_f8._0_4_) {
    if (local_f8._0_4_ == cmd_protocol_big) goto LAB_002caee5;
    if (local_f8._0_4_ != cmd_invalid) goto LAB_002caf9f;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"invalid command received",0x18);
    ActionMessage::ActionMessage((ActionMessage *)local_1b0,local_f8._0_4_);
    poVar4 = helics::operator<<((ostream *)&std::cerr,(ActionMessage *)local_1b0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    ActionMessage::~ActionMessage((ActionMessage *)local_1b0);
    goto LAB_002cafc2;
  }
  if ((local_f8._0_4_ == cmd_protocol_priority) || (local_f8._0_4_ == cmd_protocol)) {
LAB_002caee5:
    if (0x9da < (int)local_f8._4_4_) {
      status = ERRORED;
      if ((int)local_f8._4_4_ < 0xaa6) {
        if (local_f8._4_4_ == 0x9db) {
          status = TERMINATED;
        }
        else if (local_f8._4_4_ != 0xa3f) goto LAB_002caf9f;
LAB_002cb02d:
        LOCK();
        (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
        UNLOCK();
      }
      else {
        if (local_f8._4_4_ == 0xaa6) goto LAB_002cb02d;
        if (local_f8._4_4_ == 0xed3) {
          local_1b0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x2;
          std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                    ((duration<long,_std::ratio<1L,_1L>_> *)local_1b0);
          goto LAB_002cb0ec;
        }
        status = TERMINATED;
        if (local_f8._4_4_ != 0x16570bf) goto LAB_002caf9f;
      }
      iVar1 = -1;
      CommsInterface::setRxStatus((CommsInterface *)this,status);
      goto LAB_002cb135;
    }
    if ((int)local_f8._4_4_ < 0x14d) {
      if (local_f8._4_4_ != 299) {
        if (local_f8._4_4_ == 0x130) {
          iVar1 = 0;
          CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
          goto LAB_002cb135;
        }
        goto LAB_002caf9f;
      }
      if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b0,&local_58);
        if (local_1b0._8_8_ - local_1b0._0_8_ == 0x60) {
          local_1c0._M_len = local_78;
          local_1c0._M_str = (char *)local_68;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::
          _M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)connection_info,&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b0._0_8_ + 0x40));
        }
        else {
          local_1c0._M_len = local_78;
          local_1c0._M_str = (char *)local_68;
          local_40._M_len = local_78;
          local_40._M_str = (char *)local_68;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::
          _M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)connection_info,&local_1c0,&local_40);
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b0);
        iVar1 = 3;
        goto LAB_002cb135;
      }
    }
    else {
      if (local_f8._4_4_ == 0x14d) {
        message._M_str = "got new broker information";
        message._M_len = 0x1a;
        CommsInterface::logMessage((CommsInterface *)this,message);
        address = ActionMessage::getString_abi_cxx11_((ActionMessage *)local_f8,0);
        gmlc::networking::extractInterfaceAndPort
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)local_1b0,(string *)address);
        (this->super_NetworkCommsInterface).brokerPort = local_190;
        iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1b0,"?");
        if (iVar1 != 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != &local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
        }
LAB_002cb0ec:
        iVar1 = 5;
        goto LAB_002cb135;
      }
      if (local_f8._4_4_ != 0x5ab) {
        if (local_f8._4_4_ == 1999) {
          iVar1 = 0;
          CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
          goto LAB_002cb135;
        }
        goto LAB_002caf9f;
      }
      NetworkCommsInterface::loadPortDefinitions
                (&this->super_NetworkCommsInterface,(ActionMessage *)local_f8);
    }
  }
  else {
LAB_002caf9f:
    if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.super__Function_base
        ._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback
               ,(ActionMessage *)local_f8);
  }
LAB_002cafc2:
  iVar1 = 0;
LAB_002cb135:
  ActionMessage::~ActionMessage((ActionMessage *)local_f8);
  return iVar1;
}

Assistant:

int ZmqCommsSS::processIncomingMessage(zmq::message_t& msg,
                                       std::map<std::string, std::string>& connection_info)
{
    int status = 0;
    if (msg.size() == 5) {
        std::string str(static_cast<char*>(msg.data()), msg.size());
        if (str == "close") {
            return (-1);
        }
    }
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());

    if (!isValidCommand(M)) {
        std::cerr << "invalid command received" << M.action() << std::endl;
        return 0;
    }
    bool handled{false};
    if (isProtocolCommand(M)) {
        handled = true;
        switch (M.messageID) {
            case PORT_DEFINITIONS:
                loadPortDefinitions(M);
                break;
            case NAME_NOT_FOUND:
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                status = -1;
                break;
            case CONNECTION_ACK:
                setTxStatus(ConnectionStatus::CONNECTED);
                break;
            case DISCONNECT:
                disconnecting = true;
                setRxStatus(ConnectionStatus::TERMINATED);
                status = -1;
                break;
            case DISCONNECT_ERROR:
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                status = -1;
                break;
            case CLOSE_RECEIVER:
                setRxStatus(ConnectionStatus::TERMINATED);
                status = -1;
                break;
            case RECONNECT_RECEIVER:
                setRxStatus(ConnectionStatus::CONNECTED);
                break;
            case CONNECTION_INFORMATION:
                if (serverMode) {
                    auto sdata = M.getStringData();
                    if (sdata.size() == 3) {
                        connection_info.emplace(M.name(), sdata[2]);
                    } else {
                        connection_info.emplace(M.name(), M.payload.to_string());
                    }
                    status = 3;
                }
                break;
            case NEW_BROKER_INFORMATION: {
                logMessage("got new broker information");
                auto brkprt = gmlc::networking::extractInterfaceAndPort(M.getString(0));
                brokerPort = brkprt.second;
                if (brkprt.first != "?") {
                    brokerTargetAddress = brkprt.first;
                }
                status = 5;
            } break;
            case DELAY_CONNECTION:
                std::this_thread::sleep_for(std::chrono::seconds(2));
                status = 5;  // need to reconnect after this
                break;
            default:
                handled = false;
                break;
        }
    }
    if (!handled) {
        ActionCallback(std::move(M));
    }
    return status;
}